

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ulist.cpp
# Opt level: O3

UBool ulist_removeString_63(UList *list,char *data)

{
  UList *pUVar1;
  UList *pUVar2;
  int iVar3;
  UList *pUVar4;
  UList *buffer;
  UList *pUVar5;
  
  buffer = list;
  if (list == (UList *)0x0) {
    return '\0';
  }
  do {
    buffer = (UList *)buffer->head;
    if (buffer == (UList *)0x0) {
      return '\0';
    }
    iVar3 = strcmp(data,(char *)buffer->curr);
  } while (iVar3 != 0);
  pUVar1 = (UList *)buffer->head;
  pUVar2 = (UList *)buffer->tail;
  pUVar4 = pUVar2;
  if (pUVar2 == (UList *)0x0) {
    pUVar4 = list;
  }
  pUVar5 = pUVar1;
  if (pUVar1 == (UList *)0x0) {
    pUVar5 = list;
  }
  pUVar4->head = (UListNode *)pUVar1;
  pUVar5->tail = (UListNode *)pUVar2;
  if ((UList *)list->curr == buffer) {
    list->curr = (UListNode *)pUVar1;
  }
  list->size = list->size + -1;
  if ((char)buffer->size != '\0') {
    uprv_free_63(buffer->curr);
  }
  uprv_free_63(buffer);
  return '\x01';
}

Assistant:

U_CAPI UBool U_EXPORT2 ulist_removeString(UList *list, const char *data) {
    if (list != NULL) {
        UListNode *pointer;
        for (pointer = list->head; pointer != NULL; pointer = pointer->next) {
            if (uprv_strcmp(data, (const char *)pointer->data) == 0) {
                ulist_removeItem(list, pointer);
                // Remove only the first occurrence, like Java LinkedList.remove(Object).
                return TRUE;
            }
        }
    }
    return FALSE;
}